

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O2

TermList __thiscall
Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::denormalize
          (MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *this)

{
  TermList TVar1;
  Lib local_b8 [16];
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_a8;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_88;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> local_68;
  PolyNf local_34;
  AnyPoly local_1c;
  
  Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Stack
            (&local_88,&this->_factors);
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
            (&local_68,(MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_88);
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
            ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_a8,&local_68);
  Lib::
  perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
            (local_b8,(Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_a8);
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[4] = '\0';
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[5] = '\0';
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[6] = '\0';
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[7] = '\0';
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._17_3_ = 0;
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._0_1_ = 2;
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[0] = (char)local_b8[0];
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[1] = (char)local_b8[1];
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[2] = (char)local_b8[2];
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[3] = (char)local_b8[3];
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content._8_3_ = SUB83(local_b8._8_8_,0);
  local_1c.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content._11_5_ = SUB85(local_b8._8_8_,3);
  PolyNf::PolyNf(&local_34,&local_1c);
  TVar1 = PolyNf::denormalize(&local_34);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_a8);
  RationalConstantType::~RationalConstantType((RationalConstantType *)&local_68);
  Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_88);
  return (TermList)TVar1._content;
}

Assistant:

TermList MonomFactors<Number>::denormalize()  const
{
  return PolyNf(AnyPoly(perfect(Polynom(Monom(MonomFactors(*this)))))).denormalize(); 
}